

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

void __thiscall corr_stack::corr_stack(corr_stack *this,vmdict_TrieNode *root)

{
  corr_state *pcVar1;
  
  pcVar1 = (corr_state *)malloc(0x38);
  pcVar1->strl = 0;
  pcVar1->dist = 0;
  pcVar1->repl = 0;
  pcVar1->ipos = 0;
  pcVar1->node = root;
  pcVar1->typ = NoChange;
  pcVar1->nxt = (corr_state *)0x0;
  this->top = pcVar1;
  return;
}

Assistant:

corr_stack(vmdict_TrieNode *root)
    {
        /* start the stack with an empty initial state */
        top = new (0) corr_state(root);
    }